

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_text_makeundo_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar IVar1;
  ImWchar *pIVar2;
  ImWchar *p;
  int i;
  int new_length_local;
  int old_length_local;
  int where_local;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  pIVar2 = stb_text_createundo(&state->undostate,where,old_length,new_length);
  if (pIVar2 != (ImWchar *)0x0) {
    for (p._0_4_ = 0; (int)p < old_length; p._0_4_ = (int)p + 1) {
      IVar1 = STB_TEXTEDIT_GETCHAR(str,where + (int)p);
      pIVar2[(int)p] = IVar1;
    }
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}